

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O0

bilingual_str * tinyformat::format<bilingual_str>(bilingual_str *fmt,bilingual_str *args)

{
  anon_class_1_0_00000001 *in_RSI;
  bilingual_str *in_RDI;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 translate_arg;
  bool translated;
  bilingual_str *arg;
  bilingual_str *args_00;
  string *fmt_00;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 0;
  fmt_00 = (string *)&stack0xfffffffffffffff7;
  translated = SUB81((ulong)in_RDI >> 0x38,0);
  arg = in_RDI;
  args_00 = in_RDI;
  format<bilingual_str>(bilingual_str_const&,bilingual_str_const&)::{lambda(auto:1_const&,bool)#1}::
  operator()(in_RSI,in_RDI,translated);
  format<std::__cxx11::string>(fmt_00,&args_00->original);
  format<bilingual_str>(bilingual_str_const&,bilingual_str_const&)::{lambda(auto:1_const&,bool)#1}::
  operator()(in_RSI,arg,translated);
  format<std::__cxx11::string>(fmt_00,&args_00->original);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}